

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void InitOrLoadWindowSettings(ImGuiWindow *window,ImGuiWindowSettings *settings)

{
  ImVec2 IVar1;
  bool bVar2;
  ImVec2 IVar3;
  float fVar4;
  float fVar5;
  
  IVar1 = ((*(GImGui->Viewports).Data)->super_ImGuiViewport).Pos;
  fVar4 = IVar1.x + 60.0;
  fVar5 = IVar1.y + 60.0;
  IVar1.y = fVar5;
  IVar1.x = fVar4;
  window->Pos = IVar1;
  (window->Size).x = 0.0;
  (window->Size).y = 0.0;
  (window->SizeFull).x = 0.0;
  (window->SizeFull).y = 0.0;
  *(uint *)&window->field_0xf0 = (uint)(byte)window->field_0xf3 << 0x18 | 0xf0f0f;
  if (settings == (ImGuiWindowSettings *)0x0) {
    IVar3.y = fVar5;
    IVar3.x = fVar4;
  }
  else {
    SetWindowConditionAllowFlags(window,4,false);
    ApplyWindowSettings(window,settings);
    IVar3 = window->Pos;
  }
  (window->DC).IdealMaxPos = IVar3;
  (window->DC).CursorMaxPos = IVar3;
  (window->DC).CursorStartPos = IVar3;
  if ((window->Flags & 0x40) == 0) {
    if ((window->Size).x <= 0.0) {
      window->AutoFitFramesX = '\x02';
    }
    if ((window->Size).y <= 0.0) {
      window->AutoFitFramesY = '\x02';
    }
    bVar2 = true;
    if (window->AutoFitFramesX < '\x01') {
      bVar2 = '\0' < window->AutoFitFramesY;
    }
  }
  else {
    window->AutoFitFramesX = '\x02';
    window->AutoFitFramesY = '\x02';
    bVar2 = false;
  }
  window->AutoFitOnlyGrows = bVar2;
  return;
}

Assistant:

static void InitOrLoadWindowSettings(ImGuiWindow* window, ImGuiWindowSettings* settings)
{
    // Initial window state with e.g. default/arbitrary window position
    // Use SetNextWindowPos() with the appropriate condition flag to change the initial position of a window.
    const ImGuiViewport* main_viewport = ImGui::GetMainViewport();
    window->Pos = main_viewport->Pos + ImVec2(60, 60);
    window->Size = window->SizeFull = ImVec2(0, 0);
    window->SetWindowPosAllowFlags = window->SetWindowSizeAllowFlags = window->SetWindowCollapsedAllowFlags = ImGuiCond_Always | ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing;

    if (settings != NULL)
    {
        SetWindowConditionAllowFlags(window, ImGuiCond_FirstUseEver, false);
        ApplyWindowSettings(window, settings);
    }
    window->DC.CursorStartPos = window->DC.CursorMaxPos = window->DC.IdealMaxPos = window->Pos; // So first call to CalcWindowContentSizes() doesn't return crazy values

    if ((window->Flags & ImGuiWindowFlags_AlwaysAutoResize) != 0)
    {
        window->AutoFitFramesX = window->AutoFitFramesY = 2;
        window->AutoFitOnlyGrows = false;
    }
    else
    {
        if (window->Size.x <= 0.0f)
            window->AutoFitFramesX = 2;
        if (window->Size.y <= 0.0f)
            window->AutoFitFramesY = 2;
        window->AutoFitOnlyGrows = (window->AutoFitFramesX > 0) || (window->AutoFitFramesY > 0);
    }
}